

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int op_http_conn_read(OpusHTTPConn *_conn,char *_buf,int _buf_size,int _blocking)

{
  SSL *ssl;
  int iVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  ssize_t ret_1;
  int ret;
  int err;
  int nread_unblocked;
  int nread;
  SSL *ssl_conn;
  pollfd fd;
  int _blocking_local;
  int _buf_size_local;
  char *_buf_local;
  OpusHTTPConn *_conn_local;
  
  ssl_conn._0_4_ = _conn->fd;
  ssl = (SSL *)_conn->ssl_conn;
  ret = 0;
  err = 0;
  fd.fd = _blocking;
  fd._4_4_ = _buf_size;
  do {
    if (ssl == (SSL *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sVar4 = recv((op_sock)ssl_conn,_buf + err,(long)(fd._4_4_ - err),0);
      if (sVar4 < 1) {
        if ((sVar4 != 0) && (err < 1)) {
          piVar3 = __errno_location();
          if ((*piVar3 != 0xb) && (*piVar3 != 0xb)) {
            return -0x80;
          }
          ssl_conn._4_2_ = 1;
          goto LAB_00114f51;
        }
        break;
      }
      err = (int)sVar4 + err;
      ret = (int)sVar4 + ret;
    }
    else {
      iVar1 = SSL_read(ssl,_buf + err,fd._4_4_ - err);
      if (iVar1 < 1) {
        if (0 < err) break;
        iVar2 = SSL_get_error(ssl,iVar1);
        if (iVar1 == 0) {
          if (iVar2 != 6) {
            return -0x80;
          }
          return 0;
        }
        if (iVar2 == 2) {
          ssl_conn._4_2_ = 1;
        }
        else {
          if (iVar2 != 3) {
            return -0x80;
          }
          ssl_conn._4_2_ = 4;
        }
LAB_00114f51:
        _conn->read_bytes = (long)ret + _conn->read_bytes;
        op_http_conn_read_rate_update(_conn);
        ret = 0;
        if (fd.fd == 0) break;
        iVar1 = poll((pollfd *)&ssl_conn,1,30000);
        if (iVar1 < 1) {
          return -0x80;
        }
      }
      else {
        err = iVar1 + err;
        ret = iVar1 + ret;
      }
    }
  } while (err < (int)fd._4_4_);
  _conn->read_bytes = (long)ret + _conn->read_bytes;
  return err;
}

Assistant:

static int op_http_conn_read(OpusHTTPConn *_conn,
 char *_buf,int _buf_size,int _blocking){
  struct pollfd  fd;
  SSL           *ssl_conn;
  int            nread;
  int            nread_unblocked;
  fd.fd=_conn->fd;
  ssl_conn=_conn->ssl_conn;
  nread=nread_unblocked=0;
  /*RFC 2818 says "client implementations MUST treat any premature closes as
     errors and the data received as potentially truncated," so we make very
     sure to report read errors upwards.*/
  do{
    int err;
    if(ssl_conn!=NULL){
      int ret;
      ret=SSL_read(ssl_conn,_buf+nread,_buf_size-nread);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        nread+=ret;
        nread_unblocked+=ret;
        continue;
      }
      /*If we already read some data, return it right now.*/
      if(nread>0)break;
      err=SSL_get_error(ssl_conn,ret);
      if(ret==0){
        /*Connection close.
          Check for a clean shutdown to prevent truncation attacks.
          This check always succeeds for SSLv2, as it has no "close notify"
           message and thus can't verify an orderly shutdown.*/
        return err==SSL_ERROR_ZERO_RETURN?0:OP_EREAD;
      }
      if(err==SSL_ERROR_WANT_READ)fd.events=POLLIN;
      /*Yes, renegotiations can cause SSL_read() to block for writing.*/
      else if(err==SSL_ERROR_WANT_WRITE)fd.events=POLLOUT;
      /*Some other error.*/
      else return OP_EREAD;
    }
    else{
      ssize_t ret;
      op_reset_errno();
      ret=recv(fd.fd,_buf+nread,_buf_size-nread,0);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        OP_ASSERT(ret<=_buf_size-nread);
        nread+=(int)ret;
        nread_unblocked+=(int)ret;
        continue;
      }
      /*If we already read some data or the connection was closed, return
         right now.*/
      if(ret==0||nread>0)break;
      err=op_errno();
      if(err!=EAGAIN&&err!=EWOULDBLOCK)return OP_EREAD;
      fd.events=POLLIN;
    }
    _conn->read_bytes+=nread_unblocked;
    op_http_conn_read_rate_update(_conn);
    nread_unblocked=0;
    if(!_blocking)break;
    /*Need to wait to get any data at all.*/
    if(poll(&fd,1,OP_POLL_TIMEOUT_MS)<=0)return OP_EREAD;
  }
  while(nread<_buf_size);
  _conn->read_bytes+=nread_unblocked;
  return nread;
}